

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree.cpp
# Opt level: O0

Segtree * __thiscall Segtree::rangeUpdate(Segtree *this,int fr,int to,ll x)

{
  int _l;
  int _r;
  ll _val;
  Segtree *_lson;
  Segtree *_rson;
  ll x_local;
  int to_local;
  int fr_local;
  Segtree *this_local;
  
  this_local = this;
  if ((fr < this->r) && (this->l < to)) {
    if ((this->l < fr) || (to < this->r)) {
      this_local = (Segtree *)operator_new(0x20);
      _l = this->l;
      _r = this->r;
      _val = this->val;
      _lson = rangeUpdate(this->lson,fr,to,x);
      _rson = rangeUpdate(this->rson,fr,to,x);
      Segtree(this_local,_l,_r,_val,_lson,_rson);
    }
    else {
      this_local = (Segtree *)operator_new(0x20);
      Segtree(this_local,this->l,this->r,this->val + x,this->lson,this->rson);
    }
  }
  return this_local;
}

Assistant:

Segtree* rangeUpdate(int fr, int to, ll x) {
        if (fr >= r || l >= to) return this; // Range is not in the segment
        if (fr <= l && to >= r) { // Range is completely in the segment
            return new Segtree(l, r, val + x, lson, rson);
        }
        return new Segtree(l, r, val,
                           lson->rangeUpdate(fr, to, x),
                           rson->rangeUpdate(fr, to, x));
    }